

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::NumConsumedLocations
          (ValidationState_t *_,Instruction *type,uint32_t *num_locations)

{
  bool bVar1;
  AddressingModel AVar2;
  StorageClass SVar3;
  uint uVar4;
  spv_result_t sVar5;
  Instruction *pIVar6;
  ulong index;
  string sStack_228;
  uint32_t member_locations;
  _Head_base<1UL,_bool,_false> local_204;
  char local_203;
  spv_result_t local_38;
  
  *num_locations = 0;
  switch((type->inst_).opcode) {
  case 0x17:
    bVar1 = ValidationState_t::ContainsSizedIntOrFloatType(_,(type->inst_).result_id,OpTypeInt,0x40)
    ;
    if (((bVar1) ||
        (bVar1 = ValidationState_t::ContainsSizedIntOrFloatType
                           (_,(type->inst_).result_id,OpTypeFloat,0x40), bVar1)) &&
       (uVar4 = Instruction::GetOperandAs<unsigned_int>(type,2), 2 < uVar4)) {
      *num_locations = 2;
      return SPV_SUCCESS;
    }
  case 0x15:
  case 0x16:
switchD_002928ea_caseD_15:
    *num_locations = 1;
    return SPV_SUCCESS;
  case 0x18:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    NumConsumedLocations(_,pIVar6,num_locations);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,2);
    *num_locations = uVar4 * *num_locations;
    return SPV_SUCCESS;
  case 0x1c:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    NumConsumedLocations(_,pIVar6,num_locations);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,2);
    ValidationState_t::EvalInt32IfConst
              ((tuple<bool,_bool,_unsigned_int> *)&member_locations,_,uVar4);
    if (local_203 != '\x01') {
      return SPV_SUCCESS;
    }
    if (local_204._M_head_impl != false) {
      *num_locations = member_locations * *num_locations;
      return SPV_SUCCESS;
    }
    return SPV_SUCCESS;
  case 0x1e:
    bVar1 = ValidationState_t::HasDecoration(_,(type->inst_).result_id,Location);
    if (!bVar1) {
      index = 1;
      while( true ) {
        if ((ulong)((long)(type->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(type->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= index) {
          return SPV_SUCCESS;
        }
        member_locations = 0;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(type,index);
        pIVar6 = ValidationState_t::FindDef(_,uVar4);
        sVar5 = NumConsumedLocations(_,pIVar6,&member_locations);
        if (sVar5 != SPV_SUCCESS) break;
        *num_locations = *num_locations + member_locations;
        index = (ulong)((int)index + 1);
      }
      return sVar5;
    }
    ValidationState_t::diag((DiagnosticStream *)&member_locations,_,SPV_ERROR_INVALID_DATA,type);
    ValidationState_t::VkErrorID_abi_cxx11_(&sStack_228,_,0x1336,(char *)0x0);
    std::operator<<((ostream *)&member_locations,(string *)&sStack_228);
    std::operator<<((ostream *)&member_locations,"Members cannot be assigned a location");
    std::__cxx11::string::_M_dispose();
    break;
  case 0x20:
    AVar2 = ValidationState_t::addressing_model(_);
    if ((AVar2 == PhysicalStorageBuffer64) &&
       (SVar3 = Instruction::GetOperandAs<spv::StorageClass>(type,1), SVar3 == PhysicalStorageBuffer
       )) goto switchD_002928ea_caseD_15;
  default:
    ValidationState_t::diag((DiagnosticStream *)&member_locations,_,SPV_ERROR_INVALID_DATA,type);
    std::operator<<((ostream *)&member_locations,"Invalid type to assign a location");
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&member_locations);
  return local_38;
}

Assistant:

spv_result_t NumConsumedLocations(ValidationState_t& _, const Instruction* type,
                                  uint32_t* num_locations) {
  *num_locations = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      // Scalars always consume a single location.
      *num_locations = 1;
      break;
    case spv::Op::OpTypeVector:
      // 3- and 4-component 64-bit vectors consume two locations.
      if ((_.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeInt, 64) ||
           _.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeFloat,
                                         64)) &&
          (type->GetOperandAs<uint32_t>(2) > 2)) {
        *num_locations = 2;
      } else {
        *num_locations = 1;
      }
      break;
    case spv::Op::OpTypeMatrix:
      // Matrices consume locations equal to the underlying vector type for
      // each column.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      *num_locations *= type->GetOperandAs<uint32_t>(2);
      break;
    case spv::Op::OpTypeArray: {
      // Arrays consume locations equal to the underlying type times the number
      // of elements in the vector.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      bool is_int = false;
      bool is_const = false;
      uint32_t value = 0;
      // Attempt to evaluate the number of array elements.
      std::tie(is_int, is_const, value) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (is_int && is_const) *num_locations *= value;
      break;
    }
    case spv::Op::OpTypeStruct: {
      // Members cannot have location decorations at this point.
      if (_.HasDecoration(type->id(), spv::Decoration::Location)) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4918) << "Members cannot be assigned a location";
      }

      // Structs consume locations equal to the sum of the locations consumed
      // by the members.
      for (uint32_t i = 1; i < type->operands().size(); ++i) {
        uint32_t member_locations = 0;
        if (auto error = NumConsumedLocations(
                _, _.FindDef(type->GetOperandAs<uint32_t>(i)),
                &member_locations)) {
          return error;
        }
        *num_locations += member_locations;
      }
      break;
    }
    case spv::Op::OpTypePointer: {
      if (_.addressing_model() ==
              spv::AddressingModel::PhysicalStorageBuffer64 &&
          type->GetOperandAs<spv::StorageClass>(1) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        *num_locations = 1;
        break;
      }
      [[fallthrough]];
    }
    default:
      return _.diag(SPV_ERROR_INVALID_DATA, type)
             << "Invalid type to assign a location";
  }

  return SPV_SUCCESS;
}